

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::Write
          (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this,TPZStream *str,int withclassid)

{
  int refpatternindex;
  undefined1 local_14 [4];
  
  TPZGeoElRefLess<pzgeom::TPZGeoCube>::Write
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>,str,withclassid);
  TPZStream::Write<long>(str,&this->fSubEl);
  (*str->_vptr_TPZStream[3])(str,local_14,1);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Write(TPZStream &str, int withclassid) const {
    TPZGeoElRefLess<TGeo>::Write(str, withclassid);
    str.Write(this->fSubEl);
    int refpatternindex = -1;
    if (fRefPattern) refpatternindex = fRefPattern->Id();
    str.Write(&refpatternindex, 1);
}